

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

int loadbuffer(char *bname)

{
  int iVar1;
  int iVar2;
  buffer *pbVar3;
  char *fn;
  
  if (*bname == '*') {
    iVar1 = 0;
    pbVar3 = bfind(bname,0);
    if (pbVar3 != (buffer *)0x0) {
      curbp = pbVar3;
      iVar1 = showbuffer(pbVar3,curwp,8);
      return iVar1;
    }
  }
  else {
    fn = adjustname(bname,1);
    iVar1 = 0;
    if (fn != (char *)0x0) {
      pbVar3 = findbuffer(fn);
      if (pbVar3 != (buffer *)0x0) {
        curbp = pbVar3;
        iVar2 = showbuffer(pbVar3,curwp,8);
        if ((iVar2 == 1) && (iVar1 = 1, pbVar3->b_fname[0] == '\0')) {
          iVar2 = readin(fn);
          if (iVar2 != 1) {
            killbuffer(pbVar3);
            iVar1 = 0;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int
loadbuffer(char *bname)
{
	struct buffer *bufp;
	char *adjf;

	/* check for special buffers which begin with '*' */
	if (bname[0] == '*') {
		if ((bufp = bfind(bname, FALSE)) != NULL) {
			curbp = bufp;
			return (showbuffer(bufp, curwp, WFFULL));
		} else {
			return (FALSE);
		}
	} else {
		if ((adjf = adjustname(bname, TRUE)) == NULL)
			return (FALSE);
		if ((bufp = findbuffer(adjf)) == NULL)
			return (FALSE);
	}
	curbp = bufp;
	if (showbuffer(bufp, curwp, WFFULL) != TRUE)
		return (FALSE);
	if (bufp->b_fname[0] == '\0') {
		if (readin(adjf) != TRUE) {
			killbuffer(bufp);
			return (FALSE);
		}
	}
	return (TRUE);
}